

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::LogFormat::parseFromFormat(LogFormat *this,string_t *userFormat)

{
  long lVar1;
  anon_class_16_2_fe2d67eb conditionalAddFlag;
  string_t formatCopy;
  
  std::__cxx11::string::string((string *)&formatCopy,(string *)userFormat);
  this->m_flags = 0;
  conditionalAddFlag.formatCopy = &formatCopy;
  conditionalAddFlag.this = this;
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%app",AppName);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%level",Level);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%levshort",LevelShort);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%logger",LoggerId);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%thread",ThreadId);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%file",File);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%fbase",FileBase);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%line",Line);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%loc",Location);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%func",Function);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%user",User);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%host",Host);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%msg",LogMessage);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()(&conditionalAddFlag,"%vlevel",VerboseLevel);
  lVar1 = std::__cxx11::string::find((char *)&formatCopy,0x185e60);
  if (lVar1 != -1) {
    while (lVar1 != 0) {
      if (formatCopy._M_dataplus._M_p[lVar1 + -1] != '%') {
        if (lVar1 == -1) goto LAB_0016ce38;
        break;
      }
      lVar1 = std::__cxx11::string::find((char *)&formatCopy,0x185e60);
    }
    *(byte *)&this->m_flags = (byte)this->m_flags | 2;
    (*(this->super_Loggable)._vptr_Loggable[3])(this,lVar1,&formatCopy);
  }
LAB_0016ce38:
  std::__cxx11::string::_M_assign((string *)&this->m_format);
  (*(this->super_Loggable)._vptr_Loggable[4])(this);
  std::__cxx11::string::~string((string *)&formatCopy);
  return;
}

Assistant:

void LogFormat::parseFromFormat(const base::type::string_t& userFormat) {
  // We make copy because we will be changing the format
  // i.e, removing user provided date format from original format
  // and then storing it.
  base::type::string_t formatCopy = userFormat;
  m_flags = 0x0;
  auto conditionalAddFlag = [&](const base::type::char_t* specifier, base::FormatFlags flag) {
    std::size_t foundAt = base::type::string_t::npos;
    while ((foundAt = formatCopy.find(specifier, foundAt + 1)) != base::type::string_t::npos) {
      if (foundAt > 0 && formatCopy[foundAt - 1] == base::consts::kFormatSpecifierChar) {
        if (hasFlag(flag)) {
          // If we already have flag we remove the escape chars so that '%%' is turned to '%'
          // even after specifier resolution - this is because we only replaceFirst specifier
          formatCopy.erase(foundAt > 0 ? foundAt - 1 : 0, 1);
          ++foundAt;
        }
      } else {
        if (!hasFlag(flag)) addFlag(flag);
      }
    }
  };
  conditionalAddFlag(base::consts::kAppNameFormatSpecifier, base::FormatFlags::AppName);
  conditionalAddFlag(base::consts::kSeverityLevelFormatSpecifier, base::FormatFlags::Level);
  conditionalAddFlag(base::consts::kSeverityLevelShortFormatSpecifier, base::FormatFlags::LevelShort);
  conditionalAddFlag(base::consts::kLoggerIdFormatSpecifier, base::FormatFlags::LoggerId);
  conditionalAddFlag(base::consts::kThreadIdFormatSpecifier, base::FormatFlags::ThreadId);
  conditionalAddFlag(base::consts::kLogFileFormatSpecifier, base::FormatFlags::File);
  conditionalAddFlag(base::consts::kLogFileBaseFormatSpecifier, base::FormatFlags::FileBase);
  conditionalAddFlag(base::consts::kLogLineFormatSpecifier, base::FormatFlags::Line);
  conditionalAddFlag(base::consts::kLogLocationFormatSpecifier, base::FormatFlags::Location);
  conditionalAddFlag(base::consts::kLogFunctionFormatSpecifier, base::FormatFlags::Function);
  conditionalAddFlag(base::consts::kCurrentUserFormatSpecifier, base::FormatFlags::User);
  conditionalAddFlag(base::consts::kCurrentHostFormatSpecifier, base::FormatFlags::Host);
  conditionalAddFlag(base::consts::kMessageFormatSpecifier, base::FormatFlags::LogMessage);
  conditionalAddFlag(base::consts::kVerboseLevelFormatSpecifier, base::FormatFlags::VerboseLevel);
  // For date/time we need to extract user's date format first
  std::size_t dateIndex = std::string::npos;
  if ((dateIndex = formatCopy.find(base::consts::kDateTimeFormatSpecifier)) != std::string::npos) {
    while (dateIndex > 0 && formatCopy[dateIndex - 1] == base::consts::kFormatSpecifierChar) {
      dateIndex = formatCopy.find(base::consts::kDateTimeFormatSpecifier, dateIndex + 1);
    }
    if (dateIndex != std::string::npos) {
      addFlag(base::FormatFlags::DateTime);
      updateDateFormat(dateIndex, formatCopy);
    }
  }
  m_format = formatCopy;
  updateFormatSpec();
}